

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeChangeP4Full(Vdbe *p,Op *pOp,char *zP4,int n)

{
  char *pcVar1;
  int local_24;
  int n_local;
  char *zP4_local;
  Op *pOp_local;
  Vdbe *p_local;
  
  if (pOp->p4type != '\0') {
    freeP4(p->db,(int)pOp->p4type,(pOp->p4).p);
    pOp->p4type = '\0';
    (pOp->p4).p = (void *)0x0;
  }
  if (n < 0) {
    sqlite3VdbeChangeP4(p,(int)(((long)pOp - (long)p->aOp) / 0x18),zP4,n);
  }
  else {
    local_24 = n;
    if (n == 0) {
      local_24 = sqlite3Strlen30(zP4);
    }
    pcVar1 = sqlite3DbStrNDup(p->db,zP4,(long)local_24);
    (pOp->p4).z = pcVar1;
    pOp->p4type = -7;
  }
  return;
}

Assistant:

static void SQLITE_NOINLINE vdbeChangeP4Full(
  Vdbe *p,
  Op *pOp,
  const char *zP4,
  int n
){
  if( pOp->p4type ){
    freeP4(p->db, pOp->p4type, pOp->p4.p);
    pOp->p4type = 0;
    pOp->p4.p = 0;
  }
  if( n<0 ){
    sqlite3VdbeChangeP4(p, (int)(pOp - p->aOp), zP4, n);
  }else{
    if( n==0 ) n = sqlite3Strlen30(zP4);
    pOp->p4.z = sqlite3DbStrNDup(p->db, zP4, n);
    pOp->p4type = P4_DYNAMIC;
  }
}